

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxUnaryNotBoolean::Emit(FxUnaryNotBoolean *this,VMFunctionBuilder *build)

{
  PType *pPVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint opc;
  uint extraout_var;
  ExpEmit EVar5;
  
  if (this->Operand->ValueType != (PType *)TypeBool) {
    __assert_fail("Operand->ValueType == TypeBool",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x781,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
  }
  pPVar1 = (this->super_FxExpression).ValueType;
  if (pPVar1 != (PType *)TypeBool) {
    cVar2 = (**(code **)(*(long *)&pPVar1->super_PTypeBase + 0x40))();
    if ((cVar2 == '\0') || (((this->super_FxExpression).ValueType)->RegType != '\0')) {
      __assert_fail("ValueType == TypeBool || IsInteger()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x782,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
    }
  }
  uVar3 = (*this->Operand->_vptr_FxExpression[9])(this->Operand,build);
  if (((extraout_var & 0x100) == 0) && ((uVar3 & 0xfc0000) == 0 && (extraout_var & 1) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var,uVar3) >> 0x10) & 3),uVar3 & 0xffff,
               uVar3 >> 0x18);
  }
  uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
  if ((extraout_var & 1) == 0) {
    opc = VMFunctionBuilder::GetConstantInt(build,1);
    VMFunctionBuilder::Emit(build,0x7c,uVar4 & 0xffff,uVar3 & 0xffff,opc);
    EVar5._0_4_ = uVar4 & 0xffff | 0x1000000;
    EVar5.Konst = false;
    EVar5.Fixed = false;
    EVar5.Final = false;
    EVar5.Target = false;
    return EVar5;
  }
  __assert_fail("!from.Konst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x786,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *build)
{
	assert(Operand->ValueType == TypeBool);
	assert(ValueType == TypeBool || IsInteger());	// this may have been changed by an int cast.
	ExpEmit from = Operand->Emit(build);
	from.Free(build);
	ExpEmit to(build, REGT_INT);
	assert(!from.Konst);
	// boolean not is the same as XOR-ing the lowest bit

	build->Emit(OP_XOR_RK, to.RegNum, from.RegNum, build->GetConstantInt(1));
	return to;
}